

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
* __thiscall
data_structures::
LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
::insertAfterNode(LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  *this,ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                        *_current,
                 SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
                 *new_element)

{
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar1;
  SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  *new_element_local;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *_current_local;
  LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *this_local;
  
  pLVar1 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ::ListNode(pLVar1,new_element,
             (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
              *)0x0);
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ::insertAfter(_current,pLVar1);
  this->_size = this->_size + 1;
  if (_current == this->_tail) {
    pLVar1 = ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
             ::next(_current);
    this->_tail = pLVar1;
  }
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::insertAfterNode(ListNode<T>* _current, const T &new_element){
        _current->insertAfter(new ListNode<T>(new_element));
        _size++;
        if (_current == _tail) {
            _tail = _current->next();
        }
        return this;
    }